

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complex.cpp
# Opt level: O2

int __thiscall
ary::TemplatePlaneVerifier::verify
          (TemplatePlaneVerifier *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,
          size_t tbslen)

{
  Mat *mask;
  undefined4 uVar1;
  undefined4 uVar3;
  undefined8 uVar2;
  _OutputArray *p_Var4;
  TemplatePlaneVerifier *this_00;
  double dVar5;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> mask_points;
  _InputArray local_220;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> template_points;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> bounds_points;
  _InputArray local_1c0;
  vector<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_> model_points;
  undefined8 local_190;
  undefined1 local_188 [24];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_170;
  vector<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_> image_points;
  _InputArray local_150;
  _OutputArray local_138;
  _InputArray local_120;
  Mat homography;
  Scalar_<double> local_a8;
  Mat verification;
  
  model_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  homography.flags = 0;
  homography.dims = 0;
  model_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  model_points.super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  homography.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&model_points,
             (Point3_<float> *)&homography);
  homography.flags = (int)(float)(this->model_size).width;
  homography.dims = 0;
  homography.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&model_points,
             (Point3_<float> *)&homography);
  homography.flags = (int)(float)(this->model_size).width;
  homography.dims = (int)(float)(this->model_size).height;
  homography.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&model_points,
             (Point3_<float> *)&homography);
  homography.dims = (int)(float)(this->model_size).height;
  homography.flags = 0;
  homography.rows = 0;
  std::vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>>::
  emplace_back<cv::Point3_<float>>
            ((vector<cv::Point3_<float>,std::allocator<cv::Point3_<float>>> *)&model_points,
             (Point3_<float> *)&homography);
  image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x81030015;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&model_points;
  (**(code **)(**(long **)sig + 0x10))((pointer)&mask_points);
  template_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
  .super__Vector_impl_data._M_start =
       (pointer)CONCAT44(template_points.
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0xc1020005);
  template_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x300000001;
  template_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)&mask_points;
  (**(code **)(**(long **)sig + 0x10))(&local_1c0);
  local_220.obj = (void *)((long)&local_1c0.obj + 4);
  local_220.flags = -0x3efdfffb;
  local_220.sz.width = 1;
  local_220.sz.height = 3;
  CameraUser::getCameraModel((CameraUser *)(local_188 + 0x10));
  CameraModel::getIntrinsics((CameraModel *)local_188._16_8_);
  local_150.flags = -0x3efdfffb;
  local_150.sz.width = 3;
  local_150.sz.height = 3;
  local_150.obj = &verification;
  CameraUser::getCameraModel((CameraUser *)local_188);
  CameraModel::getDistortion(&homography,(CameraModel *)local_188._0_8_);
  local_120.sz.width = 0;
  local_120.sz.height = 0;
  local_120.flags = 0x1010000;
  local_138.super__InputArray.sz.width = 0;
  local_138.super__InputArray.sz.height = 0;
  local_138.super__InputArray.flags = -0x7dfcfff3;
  local_138.super__InputArray.obj = &image_points;
  local_120.obj = &homography;
  p_Var4 = (_OutputArray *)cv::noArray();
  cv::projectPoints((_InputArray *)&bounds_points,(_InputArray *)&template_points,&local_220,
                    &local_150,&local_120,&local_138,p_Var4,0.0);
  cv::Mat::~Mat(&homography);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_188 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_170);
  template_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  template_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  template_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  homography.flags = 0;
  homography.dims = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&template_points,
             (Point_<float> *)&homography);
  homography.flags = (int)(float)(this->model_template).cols;
  homography.dims = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&template_points,
             (Point_<float> *)&homography);
  uVar1 = (this->model_template).rows;
  uVar3 = (this->model_template).cols;
  homography.dims = (int)(float)(int)uVar1;
  homography.flags = (int)(float)(int)uVar3;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&template_points,
             (Point_<float> *)&homography);
  homography.dims = (int)(float)(this->model_template).rows;
  homography.flags = 0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&template_points,
             (Point_<float> *)&homography);
  verification.data = (uchar *)0x0;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  verification.flags = -0x7efcfff3;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0x8103000d;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&template_points;
  verification._8_8_ = &image_points;
  cv::getPerspectiveTransform
            ((_InputArray *)&homography,(_InputArray *)&verification,(int)&bounds_points);
  cv::Mat::Mat(&verification);
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(mask_points.
                         super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>.
                         _M_impl.super__Vector_impl_data._M_start._4_4_,0x1010000);
  local_220.sz.width = 0;
  local_220.sz.height = 0;
  local_1c0.sz.width = 0;
  local_1c0.sz.height = 0;
  local_220.flags = 0x2010000;
  local_1c0.flags = 0x1010000;
  uVar2 = *(undefined8 *)(this->model_template).size.p;
  local_190 = CONCAT44((int)uVar2,(int)((ulong)uVar2 >> 0x20));
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)ctx;
  local_220.obj = &verification;
  local_1c0.obj = &homography;
  cv::Scalar_<double>::Scalar_((Scalar_<double> *)&bounds_points);
  cv::warpPerspective(&mask_points,&local_220,&local_1c0,&local_190,1,0,
                      (Scalar_<double> *)&bounds_points);
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  bounds_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&bounds_points,
             (Point_<float> *)&mask_points);
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)(ulong)(uint)(float)*(int *)(ctx + 0xc);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&bounds_points,
             (Point_<float> *)&mask_points);
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44((float)(int)*(undefined8 *)(ctx + 8),
                         (float)(int)((ulong)*(undefined8 *)(ctx + 8) >> 0x20));
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&bounds_points,
             (Point_<float> *)&mask_points);
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)((ulong)(uint)(float)*(int *)(ctx + 8) << 0x20);
  std::vector<cv::Point_<float>,std::allocator<cv::Point_<float>>>::emplace_back<cv::Point_<float>>
            ((vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&bounds_points,
             (Point_<float> *)&mask_points);
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_220.sz.width = 0;
  local_220.sz.height = 0;
  local_1c0.sz.width = 0;
  local_1c0.sz.height = 0;
  local_220.flags = -0x7efcfff3;
  local_1c0.flags = -0x7dfcfff3;
  local_150.sz.width = 0;
  local_150.sz.height = 0;
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_150.flags = 0x1010000;
  local_220.obj = (vector<cv::Point_<float>,std::allocator<cv::Point_<float>>> *)&bounds_points;
  local_1c0.obj = (Point_<float> *)&mask_points;
  local_150.obj = &homography;
  cv::perspectiveTransform(&local_220,(_OutputArray *)&local_1c0,&local_150);
  local_1c0.flags = 0;
  local_1c0._4_4_ = 0;
  local_220.flags = -0x3efdfffa;
  local_220.sz.width = 1;
  local_220.sz.height = 1;
  local_220.obj = &local_1c0;
  cv::noArray();
  mask = &this->model_mask;
  cv::Mat::setTo((_InputArray *)mask,&local_220);
  cv::Scalar_<double>::Scalar_(&local_a8,255.0);
  this_00 = (TemplatePlaneVerifier *)mask;
  fillPolygon(mask,&mask_points,&local_a8);
  dVar5 = match_template(this_00,&this->model_template,&verification,mask);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&mask_points.super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>
            );
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&bounds_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  cv::Mat::~Mat(&verification);
  cv::Mat::~Mat(&homography);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&template_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>::~_Vector_base
            (&image_points.
              super__Vector_base<cv::Point_<float>,_std::allocator<cv::Point_<float>_>_>);
  std::_Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>::~_Vector_base
            (&model_points.
              super__Vector_base<cv::Point3_<float>,_std::allocator<cv::Point3_<float>_>_>);
  return (int)CONCAT71((int7)((ulong)&this->model_template >> 8),0.4 < dVar5);
}

Assistant:

bool TemplatePlaneVerifier::verify(const Mat& image, const SharedPlanarLocalization& localization) {

	vector<Point3f> model_points;
	model_points.push_back(Point3f(0, 0, 0));
	model_points.push_back(Point3f(model_size.width, 0, 0));
	model_points.push_back(Point3f(model_size.width, model_size.height, 0));
	model_points.push_back(Point3f(0, model_size.height, 0));

	vector<Point2f> image_points;
	projectPoints(model_points, localization->getCameraPosition().rotation, localization->getCameraPosition().translation, getCameraModel()->getIntrinsics(), getCameraModel()->getDistortion(), image_points);

	vector<Point2f> template_points;
	template_points.push_back(Point2f(0, 0));
	template_points.push_back(Point2f(model_template.cols, 0));
	template_points.push_back(Point2f(model_template.cols, model_template.rows));
	template_points.push_back(Point2f(0, model_template.rows));

	Mat homography = getPerspectiveTransform(image_points, template_points);

	Mat verification;
	cv::warpPerspective(image, verification, homography, model_template.size());

	vector<Point2f> bounds_points;
	bounds_points.push_back(Point2f(0, 0));
	bounds_points.push_back(Point2f(image.cols, 0));
	bounds_points.push_back(Point2f(image.cols, image.rows));
	bounds_points.push_back(Point2f(0, image.rows));
	vector<Point2f> mask_points;

	perspectiveTransform(bounds_points, mask_points, homography);

	model_mask.setTo(0);

	fillPolygon(model_mask, mask_points, Scalar(255));

	double match_score = match_template(model_template, verification, model_mask);

	return (match_score > 0.4);

}